

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImGuiPlatformMonitor *pIVar2;
  ImGuiViewportP *pIVar3;
  ImVec2 *pIVar4;
  ImVec2 *pIVar5;
  long lVar6;
  ImVec2 *pIVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImRect IVar14;
  
  lVar6 = (long)window->ViewportAllowPlatformMonitorExtend;
  if (lVar6 < 0) {
    pIVar3 = window->Viewport;
    pIVar7 = &(pIVar3->super_ImGuiViewport).Pos;
    fVar13 = (pIVar3->super_ImGuiViewport).Pos.x + (pIVar3->super_ImGuiViewport).Size.x;
    pIVar4 = &(pIVar3->super_ImGuiViewport).Pos;
    pIVar5 = &(pIVar3->super_ImGuiViewport).Size;
  }
  else {
    pIVar2 = (GImGui->PlatformIO).Monitors.Data;
    pIVar7 = &pIVar2[lVar6].WorkPos;
    fVar13 = pIVar7->x + pIVar2[lVar6].WorkSize.x;
    pIVar4 = &pIVar2[lVar6].WorkPos;
    pIVar5 = &pIVar2[lVar6].WorkSize;
  }
  fVar8 = pIVar4->y + pIVar5->y;
  IVar1 = (GImGui->Style).DisplaySafeAreaPadding;
  fVar9 = (*pIVar7).x;
  fVar10 = (*pIVar7).y;
  fVar11 = IVar1.x;
  fVar12 = IVar1.y;
  fVar11 = (float)((uint)-fVar11 & -(uint)(fVar11 + fVar11 < fVar13 - fVar9));
  fVar12 = (float)((uint)-fVar12 & -(uint)(fVar12 + fVar12 < fVar8 - fVar10));
  IVar14.Min.x = fVar9 - fVar11;
  IVar14.Min.y = fVar10 - fVar12;
  IVar14.Max.x = fVar11 + fVar13;
  IVar14.Max.y = fVar12 + fVar8;
  return IVar14;
}

Assistant:

ImRect ImGui::GetWindowAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImRect r_screen;
    if (window->ViewportAllowPlatformMonitorExtend >= 0)
    {
        // Extent with be in the frame of reference of the given viewport (so Min is likely to be negative here)
        const ImGuiPlatformMonitor& monitor = g.PlatformIO.Monitors[window->ViewportAllowPlatformMonitorExtend];
        r_screen.Min = monitor.WorkPos;
        r_screen.Max = monitor.WorkPos + monitor.WorkSize;
    }
    else
    {
        r_screen.Min = window->Viewport->Pos;
        r_screen.Max = window->Viewport->Pos + window->Viewport->Size;
    }
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}